

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

bool __thiscall slang::SourceManager::isMacroArgLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  ulong uVar2;
  undefined1 uVar3;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  uVar2 = (ulong)location & 0xfffffff;
  uVar3 = 0;
  if ((uVar2 != 0) && (uVar3 = 0, location != (SourceLocation)0xffffffffffffffff)) {
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0;
    if ((pvVar1 != (pointer)0x0) &&
       (*(__index_type *)
         ((long)&pvVar1[uVar2].
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         + 0x38) == '\x01')) {
      uVar3 = *(undefined1 *)
               ((long)&pvVar1[uVar2].
                       super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               + 0x18);
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return (bool)uVar3;
}

Assistant:

bool SourceManager::isMacroArgLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return isMacroArgLocImpl(location, lock);
}